

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool __thiscall
ON_RTree::Search2d(ON_RTree *this,double *a_min,double *a_max,ON_RTreeSearchResult *a_result)

{
  bool bVar1;
  ON_RTreeBBox rect;
  ON_RTreeBBox local_38;
  
  if (this->m_root != (ON_RTreeNode *)0x0) {
    local_38.m_min[0] = *a_min;
    local_38.m_min[1] = a_min[1];
    local_38.m_min[2] = 0.0;
    local_38.m_max[0] = *a_max;
    local_38.m_max[1] = a_max[1];
    local_38.m_max[2] = 0.0;
    bVar1 = SearchHelper(this->m_root,&local_38,a_result);
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_RTree::Search2d(const double a_min[2], const double a_max[2],
                          ON_RTreeSearchResult& a_result ) const
{
  if ( 0 == m_root )
    return false;

  ON_RTreeBBox rect;
  memcpy(rect.m_min,a_min,2*sizeof(a_min[0]));
  rect.m_min[2] = 0.0;
  memcpy(rect.m_max,a_max,2*sizeof(a_max[0]));
  rect.m_max[2] = 0.0;

  return SearchHelper(m_root, &rect, a_result);
}